

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyper_log_log.hxx
# Opt level: O0

size_type __thiscall hll::hyper_log_log<int,_12UL>::count(hyper_log_log<int,_12UL> *this)

{
  const_iterator __first;
  const_iterator __last;
  double dVar1;
  int local_54;
  difference_type local_50;
  difference_type zero_registers_count;
  double estimation;
  value_type_conflict *element;
  const_iterator __end0;
  const_iterator __begin0;
  container_type *__range2;
  double count;
  double TWO_32_POWER;
  hyper_log_log<int,_12UL> *this_local;
  
  count = 4294967296.0;
  __range2 = (container_type *)0x0;
  __begin0 = (const_iterator)this;
  TWO_32_POWER = (double)this;
  __end0 = std::array<signed_char,_4096UL>::begin(&this->m_registers);
  element = std::array<signed_char,_4096UL>::end((array<signed_char,_4096UL> *)__begin0);
  for (; __end0 != element; __end0 = __end0 + 1) {
    estimation = (double)__end0;
    __range2 = (container_type *)(1.0 / (double)(uint)(1 << (*__end0 & 0x1fU)) + (double)__range2);
  }
  zero_registers_count = (difference_type)(12098218.894406674 / (double)__range2);
  if (10240.0 < (double)zero_registers_count) {
    if (143165576.53333333 < (double)zero_registers_count) {
      dVar1 = log(1.0 - (double)zero_registers_count / 4294967296.0);
      zero_registers_count = (difference_type)(dVar1 * -4294967296.0);
    }
  }
  else {
    __first = std::array<signed_char,_4096UL>::begin(&this->m_registers);
    __last = std::array<signed_char,_4096UL>::end(&this->m_registers);
    local_54 = 0;
    local_50 = std::count<signed_char_const*,int>(__first,__last,&local_54);
    if (0 < local_50) {
      dVar1 = log(4096.0 / (double)local_50);
      zero_registers_count = (difference_type)(dVar1 * 4096.0);
    }
  }
  return (long)(double)zero_registers_count |
         (long)((double)zero_registers_count - 9.223372036854776e+18) &
         (long)(double)zero_registers_count >> 0x3f;
}

Assistant:

HLL_CONSTEXPR_OR_INLINE auto hyper_log_log<T, k>::count() const
-> typename hyper_log_log<T, k>::size_type
{
    constexpr double TWO_32_POWER = 0x100000000;
    double count = 0;

    for (const auto& element : m_registers)
        count += 1.0 / (1u << element);

    // Оценка количества элементов
    auto estimation = alpha_m_squared / count;

    // корректировка результатов в зависимости от размеров оценки
    if (estimation <= 2.5 * registers_count)
    {
        const auto zero_registers_count = std::count(m_registers.begin(), m_registers.end(), 0);

        if (zero_registers_count > 0)
            // если хотя бы один регистр "пустой", то используем linear counting
            estimation = registers_count * std::log(static_cast<double>(registers_count) / zero_registers_count);
    } else if (estimation > (TWO_32_POWER / 30.0))
    { // если оценка получилась довольно большой
        estimation = -TWO_32_POWER * std::log(1.0 - (estimation / TWO_32_POWER));
    }

    return static_cast<size_type>(estimation);
}